

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.c
# Opt level: O3

void testAdjMatrixGraph(void)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  Vertices vertex;
  long lVar5;
  Edges pEVar6;
  MatrixGraph matrixGraph;
  ulong uVar7;
  long lVar8;
  int *D;
  int_0_ *P;
  int_0_ *D_00;
  int_0_ *piVar9;
  undefined1 auVar10 [16];
  undefined8 uStack_50;
  uint auStack_48 [2];
  long local_40;
  ulong local_38;
  
  uStack_50 = 0x108080;
  puts("*****************************************************");
  uStack_50 = 0x10808c;
  puts(&DAT_0010ed2c);
  uStack_50 = 0x108094;
  puts("*****************************************************");
  uStack_50 = 0x10809e;
  vertex = (Vertices)malloc(5);
  auVar4 = _DAT_0010d2b0;
  lVar5 = 0;
  auVar10 = _DAT_0010d2a0;
  do {
    if (SUB164(auVar10 ^ auVar4,4) == -0x80000000 && SUB164(auVar10 ^ auVar4,0) < -0x7ffffffb) {
      vertex[lVar5] = (char)lVar5 + 'a';
      vertex[lVar5 + 1] = (char)lVar5 + 'b';
    }
    lVar5 = lVar5 + 2;
    lVar8 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 2;
    auVar10._8_8_ = lVar8 + 2;
  } while (lVar5 != 6);
  uStack_50 = 0x10811d;
  pEVar6 = newEdgeTestCase(5);
  uStack_50 = 0x10813b;
  matrixGraph = createAdjacencyMatrix(vertex,pEVar6,5,5,DN);
  uStack_50 = 0x108146;
  showMatrixGraph_AMG(matrixGraph);
  uStack_50 = 0x108153;
  pEVar6 = (Edges)realloc(pEVar6,0x54);
  pEVar6[5].vi = 1;
  pEVar6[5].vj = 3;
  *(undefined8 *)&pEVar6[5].weight = 0x30000003c;
  pEVar6[6].vj = 2;
  pEVar6[6].weight = 0x5a;
  uStack_50 = 0x10817c;
  newEdgeForGraphVertex_AMG(matrixGraph,pEVar6,7);
  uStack_50 = 0x108184;
  showMatrixGraph_AMG(matrixGraph);
  uStack_50 = 0x108190;
  puts(&DAT_0010ef0c);
  uStack_50 = 0x108198;
  dfsTraversal_AMG(matrixGraph);
  uStack_50 = 0x1081a4;
  puts(&DAT_0010ef2b);
  uStack_50 = 0x1081ac;
  bfsTraversal_AMG(matrixGraph);
  uStack_50 = 0x1081b4;
  numOfConnectedComponents_AMG(matrixGraph);
  uStack_50 = 0x1081c4;
  printf(anon_var_dwarf_a76c);
  uStack_50 = 0x1081d0;
  puts(&DAT_0010ed72);
  uStack_50 = 0x1081d8;
  miniSpanTree_Prim(matrixGraph);
  uStack_50 = 0x1081e4;
  puts(&DAT_0010ed99);
  uStack_50 = 0x1081ec;
  miniSpanTree_Kruskal(matrixGraph);
  uStack_50 = 0x1081f8;
  puts(&DAT_0010edc2);
  lVar5 = -((ulong)(uint)matrixGraph->vexNum * 4 + 0xf & 0xfffffffffffffff0);
  D = (int *)((long)auStack_48 + lVar5);
  *(undefined8 *)((long)auStack_48 + lVar5 + -8) = 0x10821d;
  shortPath_Dijkstra(matrixGraph,0,D);
  if (0 < matrixGraph->vexNum) {
    lVar8 = 0;
    do {
      cVar1 = *matrixGraph->vertex;
      cVar2 = matrixGraph->vertex[lVar8];
      uVar3 = D[lVar8];
      *(undefined8 *)((long)auStack_48 + lVar5 + -8) = 0x108246;
      printf("%c -> %c : %d\n",(ulong)(uint)(int)cVar1,(ulong)(uint)(int)cVar2,(ulong)uVar3);
      lVar8 = lVar8 + 1;
    } while (lVar8 < matrixGraph->vexNum);
  }
  *(undefined8 *)((long)auStack_48 + lVar5 + -8) = 0x10825e;
  puts(&DAT_0010ede6);
  local_38 = (ulong)(uint)matrixGraph->vexNum;
  uVar7 = local_38 * local_38 * 4 + 0xf & 0xfffffffffffffff0;
  P = (int_0_ *)((long)D - uVar7);
  D_00 = P + -uVar7;
  *(undefined8 *)(D_00 + -8) = 0x108295;
  shortestPath_Floyd(matrixGraph,P,D_00);
  *(undefined8 *)(D_00 + -8) = 0x1082a1;
  puts(&DAT_0010ee07);
  uVar7 = (ulong)(uint)matrixGraph->vexNum;
  if (0 < matrixGraph->vexNum) {
    local_40 = local_38 * 4;
    lVar5 = 0;
    piVar9 = D_00;
    do {
      if (0 < (int)uVar7) {
        lVar8 = 0;
        do {
          if (*(int *)(piVar9 + lVar8 * 4) == 0x7fff) {
            *(undefined8 *)(D_00 + -8) = 0x1082dc;
            printf(anon_var_dwarf_a7f7);
          }
          else {
            *(undefined8 *)(D_00 + -8) = 0x1082ec;
            printf("%d\t");
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < matrixGraph->vexNum);
      }
      *(undefined8 *)(D_00 + -8) = 0x108302;
      putchar(10);
      lVar5 = lVar5 + 1;
      uVar7 = (ulong)matrixGraph->vexNum;
      piVar9 = piVar9 + local_40;
    } while (lVar5 < (long)uVar7);
  }
  *(undefined8 *)(D_00 + -8) = 0x10831e;
  puts(&DAT_0010ee12);
  uVar7 = (ulong)(uint)matrixGraph->vexNum;
  if (0 < matrixGraph->vexNum) {
    local_38 = local_38 << 2;
    lVar5 = 0;
    do {
      if (0 < (int)uVar7) {
        lVar8 = 0;
        do {
          uVar3 = *(uint *)(P + lVar8 * 4);
          *(undefined8 *)(D_00 + -8) = 0x108349;
          printf("%d\t",(ulong)uVar3);
          lVar8 = lVar8 + 1;
        } while (lVar8 < matrixGraph->vexNum);
      }
      *(undefined8 *)(D_00 + -8) = 0x10835f;
      putchar(10);
      lVar5 = lVar5 + 1;
      uVar7 = (ulong)matrixGraph->vexNum;
      P = P + local_38;
    } while (lVar5 < (long)uVar7);
  }
  *(undefined8 *)(D_00 + -8) = 0x10837b;
  puts(anon_var_dwarf_6204 + 0x43);
  return;
}

Assistant:

void testAdjMatrixGraph() {
    printf("*****************************************************\n");
    printf("*              邻接矩阵存储结构图测试例程              *\n");
    printf("*****************************************************\n");

    const int VERTEX_SIZE = 5;
    Vertices vertex = newVexTestCase(VERTEX_SIZE);

    // [a, b, c, d, e]
    Edges edge = newEdgeTestCase(VERTEX_SIZE);

    MatrixGraph matrix = createAdjacencyMatrix(vertex, edge, VERTEX_SIZE, VERTEX_SIZE, DN);
    showMatrixGraph_AMG(matrix);

    edge = reAllocEdge(VERTEX_SIZE, edge);

    newEdgeForGraphVertex_AMG(matrix, edge, VERTEX_SIZE + 2);
    showMatrixGraph_AMG(matrix);

    printf("深度优先遍历的结果：\n");
    dfsTraversal_AMG(matrix);

    printf("广度优先遍历的结果：\n");
    bfsTraversal_AMG(matrix);

    printf("连通分量的个数为：%d\n", numOfConnectedComponents_AMG(matrix));

    printf("Prime的算法计算最小生成树：\n");
    miniSpanTree_Prim(matrix);

    printf("Kruskal的算法计算最小生成树：\n");
    miniSpanTree_Kruskal(matrix);

    printf("Dijkstra算法计算最短路径：\n");
    int D[matrix->vexNum], V0 = 0;
    shortPath_Dijkstra(matrix, V0, D);
    for (int i = 0; i < matrix->vexNum; ++i)
        printf("%c -> %c : %d\n", matrix->vertex[V0], matrix->vertex[i], D[i]);

    printf("Floyd算法计算最短路径：\n");
    int P[matrix->vexNum][matrix->vexNum];
    int D_f[matrix->vexNum][matrix->vexNum];
    shortestPath_Floyd(matrix, P, D_f);
    printf("矩阵D：\n");
    for (int i = 0; i < matrix->vexNum; ++i) {
        for (int j = 0; j < matrix->vexNum; ++j)
            if (D_f[i][j] == UNFLAG_WEIGHT_GRAPH)
                printf("∞\t");
            else
                printf("%d\t", D_f[i][j]);
        printf("\n");
    }

    printf("矩阵P：\n");
    for (int i = 0; i < matrix->vexNum; ++i) {
        for (int j = 0; j < matrix->vexNum; ++j)
            printf("%d\t", P[i][j]);
        printf("\n");
    }
    puts("\n");
}